

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

int Lodtalk::ScriptContext::stAddMethod(InterpreterProxy *interpreter)

{
  Node *ast;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar5;
  NativeError *pNVar6;
  char *__function;
  AdditionalMethodState *methodState;
  Ref<Lodtalk::ClassDescription> clazz;
  shared_ptr<Lodtalk::InstanceVariableScope> instanceVarScope;
  shared_ptr<Lodtalk::GlobalEvaluationScope> globalScope;
  Ref<Lodtalk::CompiledMethod> compiledMethod;
  anon_union_8_4_0eb573b0_for_Oop_0 local_a0;
  VMContext *local_98;
  undefined1 local_90 [16];
  InstanceVariableScope *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  EvaluationScopePtr local_70;
  shared_ptr<Lodtalk::GlobalEvaluationScope> local_60;
  anon_union_8_4_0eb573b0_for_Oop_0 local_50;
  VMContext *local_48;
  VMContext *this;
  undefined8 *puVar4;
  
  iVar2 = (**interpreter->_vptr_InterpreterProxy)();
  this = (VMContext *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])(interpreter);
  if (CONCAT44(extraout_var_00,iVar2) != 1) {
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar2;
  }
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  uVar3 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  puVar4 = (undefined8 *)CONCAT44(extraout_var_02,uVar3);
  if (puVar4 != &NilObject) {
    if (((((uVar3 & 1) != 0) || ((uVar3 & 6) == 2)) || ((uVar3 & 6) == 4)) ||
       ((uint)((ulong)*puVar4 >> 0x2a) != 0x66)) {
      local_a0.pointer = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"expected a method AST handle.","");
      pNVar6 = (NativeError *)__cxa_allocate_exception(0x28);
      NativeError::NativeError(pNVar6,(string *)&local_a0);
      __cxa_throw(pNVar6,&NativeError::typeinfo,NativeError::~NativeError);
    }
    bVar1 = VMContext::isClassOrMetaclass
                      (this,(Oop)*(anon_union_8_4_0eb573b0_for_Oop_0 *)
                                  (CONCAT44(extraout_var_01,iVar2) + 0x10));
    if (!bVar1) {
      local_a0.pointer = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"a class is needed for adding a method.","");
      pNVar6 = (NativeError *)__cxa_allocate_exception(0x28);
      NativeError::NativeError(pNVar6,(string *)&local_a0);
      __cxa_throw(pNVar6,&NativeError::typeinfo,NativeError::~NativeError);
    }
    aVar5 = *(anon_union_8_4_0eb573b0_for_Oop_0 *)(CONCAT44(extraout_var_01,iVar2) + 0x10);
    local_a0.pointer = (uint8_t *)&NilObject;
    local_98 = this;
    OopRef::registerSelf((OopRef *)&local_a0);
    ast = (Node *)puVar4[1];
    local_60.super___shared_ptr<Lodtalk::GlobalEvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_a0 = aVar5;
    local_60.super___shared_ptr<Lodtalk::GlobalEvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
    (local_60.super___shared_ptr<Lodtalk::GlobalEvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_use_count = 1;
    (local_60.super___shared_ptr<Lodtalk::GlobalEvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_weak_count = 1;
    (local_60.super___shared_ptr<Lodtalk::GlobalEvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00164db8;
    local_60.super___shared_ptr<Lodtalk::GlobalEvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_60.super___shared_ptr<Lodtalk::GlobalEvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi + 1);
    local_60.super___shared_ptr<Lodtalk::GlobalEvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[1]._M_use_count = 0;
    local_60.super___shared_ptr<Lodtalk::GlobalEvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[1]._M_weak_count = 0;
    local_60.super___shared_ptr<Lodtalk::GlobalEvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    local_60.super___shared_ptr<Lodtalk::GlobalEvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__EvaluationScope_001646b0;
    *(VMContext **)
     &local_60.super___shared_ptr<Lodtalk::GlobalEvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[2]._M_use_count = this;
    local_80 = (InstanceVariableScope *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Lodtalk::InstanceVariableScope,std::allocator<Lodtalk::InstanceVariableScope>,std::shared_ptr<Lodtalk::GlobalEvaluationScope>&,Lodtalk::Ref<Lodtalk::ClassDescription>&>
              (&local_78,&local_80,(allocator<Lodtalk::InstanceVariableScope> *)&local_50,&local_60,
               (Ref<Lodtalk::ClassDescription> *)&local_a0);
    local_70.super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_80->super_EvaluationScope;
    local_70.super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_78._M_pi;
    if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
      }
    }
    aVar5.header = (ObjectHeader *)
                   compileMethod(this,&local_70,(Ref<Lodtalk::ClassDescription> *)&local_a0,ast);
    local_50.pointer = (uint8_t *)&NilObject;
    local_48 = this;
    OopRef::registerSelf((OopRef *)&local_50);
    local_50.header = aVar5.header;
    if (local_70.super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_50.pointer == (uint8_t *)&NilObject) {
      __function = 
      "T *Lodtalk::Ref<Lodtalk::CompiledMethod>::operator->() const [T = Lodtalk::CompiledMethod]";
    }
    else {
      aVar5 = (anon_union_8_4_0eb573b0_for_Oop_0)
              ((anon_union_8_4_0eb573b0_for_Oop_0 *)
              (local_50.pointer + (ulong)(*(uint *)(local_50.uintValue + 8) & 0x1fffe) * 4))->header
      ;
      if (((ulong)*aVar5.header & 0xfffffc0000000000) == 0x1500000000000) {
        aVar5 = *(anon_union_8_4_0eb573b0_for_Oop_0 *)(aVar5.uintValue + 0x10);
      }
      if (local_a0.pointer != (uint8_t *)&NilObject) {
        MethodDictionary::internalAtPut
                  (*(MethodDictionary **)(local_a0.uintValue + 0x10),this,(Oop)aVar5,(Oop)local_50);
        iVar2 = (*interpreter->_vptr_InterpreterProxy[0x12])(interpreter);
        OopRef::unregisterSelf((OopRef *)&local_50);
        if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
        }
        if (local_60.super___shared_ptr<Lodtalk::GlobalEvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_60.
                     super___shared_ptr<Lodtalk::GlobalEvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        OopRef::unregisterSelf((OopRef *)&local_a0);
        return iVar2;
      }
      __function = 
      "T *Lodtalk::Ref<Lodtalk::ClassDescription>::operator->() const [T = Lodtalk::ClassDescription]"
      ;
    }
    __assert_fail("!isNil()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                  ,0x3bf,__function);
  }
  local_a0.pointer = local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"cannot add method with nil ast.","");
  pNVar6 = (NativeError *)__cxa_allocate_exception(0x28);
  NativeError::NativeError(pNVar6,(string *)&local_a0);
  __cxa_throw(pNVar6,&NativeError::typeinfo,NativeError::~NativeError);
}

Assistant:

int ScriptContext::stAddMethod(InterpreterProxy *interpreter)
{
    auto context = interpreter->getContext();
    if(interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();
    auto self = reinterpret_cast<ScriptContext*> (interpreter->getReceiver().pointer);
    auto methodAstHandle = interpreter->getTemporary(0);

	if(isNil(methodAstHandle))
		nativeError("cannot add method with nil ast.");
	if(classIndexOf(methodAstHandle) != SCI_MethodASTHandle)
		nativeError("expected a method AST handle.");

	// Check the class
	if(!context->isClassOrMetaclass(self->currentClass))
		nativeError("a class is needed for adding a method.");
	Ref<ClassDescription> clazz(context, reinterpret_cast<ClassDescription*> (self->currentClass.pointer));

	// Get the ast
	MethodASTHandle *handle = reinterpret_cast<MethodASTHandle*> (methodAstHandle.pointer);
	auto ast = handle->ast;

	// Create the global scope
	auto globalScope = std::make_shared<GlobalEvaluationScope> (context);

	// TODO: Create the class variables scope.

	// Create the class instance variables scope.
	auto instanceVarScope = std::make_shared<InstanceVariableScope> (globalScope, clazz);

	// Compile the method
	Ref<CompiledMethod> compiledMethod(context, compileMethod(context, instanceVarScope, clazz, ast));

	// Register the method in the current class
	auto selector = compiledMethod->getSelector();
	clazz->methodDict->atPut(context, selector, compiledMethod.getOop());

	// Return self
	return interpreter->returnReceiver();
}